

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  long lVar1;
  bool bVar2;
  Type *pTVar3;
  long lVar4;
  Result *_result;
  undefined1 *puVar5;
  uint64_t uVar6;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  validateOutputCount(__return_storage_ptr__,layer,2,-1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  if (layer->_oneof_case_[0] == 0x3cf) {
    puVar5 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar5 = Specification::_SplitNDLayerParams_default_instance_;
  }
  uVar6 = (uint64_t)(((ConvolutionLayerParams *)puVar5)->kernelsize_).current_size_;
  if (((long)uVar6 < 1) && (uVar6 = ((BatchnormLayerParams *)puVar5)->channels_, uVar6 == 0)) {
    std::operator+(&local_40,"Either split_sizes or num_splits should be provided for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_40,"\' layer.");
    std::__cxx11::string::~string((string *)&local_40);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                         (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
      lVar4 = (long)(int)pTVar3->rank_;
      lVar1 = ((SplitNDLayerParams *)puVar5)->axis_;
      if ((SBORROW8(lVar1,-lVar4) != lVar1 + lVar4 < 0) || (lVar4 <= lVar1)) {
        std::operator+(&local_40,
                       "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_40,"\' layer.");
        std::__cxx11::string::~string((string *)&local_40);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        goto LAB_002ae200;
      }
    }
    if (uVar6 == (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_40,"Value of num_splits should match size of output names for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_40,"\' layer.");
    std::__cxx11::string::~string((string *)&local_40);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
LAB_002ae200:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitNDLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    size_t numSplits = 0;
    const auto& params = layer.splitnd();

    if (params.splitsizes_size() > 0) {
        numSplits = static_cast<size_t>(params.splitsizes_size());
    } else {
        numSplits = static_cast<size_t>(params.numsplits());
    }
    if (numSplits == 0) {
        const std::string err = "Either split_sizes or num_splits should be provided for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    if (numSplits != static_cast<size_t>(layer.output_size())) {
        const std::string err = "Value of num_splits should match size of output names for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}